

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

QList<QTextEdit::ExtraSelection> * __thiscall
QWidgetTextControl::extraSelections
          (QList<QTextEdit::ExtraSelection> *__return_storage_ptr__,QWidgetTextControl *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (ExtraSelection *)0x0;
  (__return_storage_ptr__->d).size = 0;
  uVar4 = (uint)*(undefined8 *)(lVar1 + 0x130);
  QList<QTextEdit::ExtraSelection>::reserve(__return_storage_ptr__,(long)(int)uVar4);
  if (0 < (int)uVar4) {
    uVar5 = (ulong)(uVar4 & 0x7fffffff);
    lVar3 = 0;
    do {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QTextCursor::QTextCursor((QTextCursor *)&local_58);
      QTextCharFormat::QTextCharFormat((QTextCharFormat *)&puStack_50);
      lVar2 = *(long *)(lVar1 + 0x128);
      QTextCursor::operator=((QTextCursor *)&local_58,(QTextCursor *)(lVar2 + lVar3));
      QTextFormat::operator=((QTextFormat *)&puStack_50,(QTextFormat *)(lVar2 + lVar3 + 8));
      QtPrivate::QGenericArrayOps<QTextEdit::ExtraSelection>::
      emplace<QTextEdit::ExtraSelection_const&>
                ((QGenericArrayOps<QTextEdit::ExtraSelection> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,(ExtraSelection *)&local_58);
      QList<QTextEdit::ExtraSelection>::end(__return_storage_ptr__);
      QTextFormat::~QTextFormat((QTextFormat *)&puStack_50);
      QTextCursor::~QTextCursor((QTextCursor *)&local_58);
      lVar3 = lVar3 + 0x18;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QTextEdit::ExtraSelection> QWidgetTextControl::extraSelections() const
{
    Q_D(const QWidgetTextControl);
    QList<QTextEdit::ExtraSelection> selections;
    const int numExtraSelections = d->extraSelections.size();
    selections.reserve(numExtraSelections);
    for (int i = 0; i < numExtraSelections; ++i) {
        QTextEdit::ExtraSelection sel;
        const QAbstractTextDocumentLayout::Selection &sel2 = d->extraSelections.at(i);
        sel.cursor = sel2.cursor;
        sel.format = sel2.format;
        selections.append(sel);
    }
    return selections;
}